

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::UnitTest::set_current_test_suite(UnitTest *this,TestSuite *a_current_test_suite)

{
  GTestMutexLock local_28;
  MutexLock lock;
  
  local_28.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_28.mutex_);
  this->impl_->current_test_suite_ = a_current_test_suite;
  internal::GTestMutexLock::~GTestMutexLock(&local_28);
  return;
}

Assistant:

void UnitTest::set_current_test_suite(TestSuite* a_current_test_suite) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_suite(a_current_test_suite);
}